

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration.c
# Opt level: O0

int registration_service_start(registration_service_handle *rs,proxy_conf *conf)

{
  undefined8 *puVar1;
  undefined1 uVar2;
  int iVar3;
  size_t sVar4;
  char *local_60;
  uint local_54;
  int ret;
  char *public_addr;
  uint8_t digest [16];
  uint8_t *local_30;
  char *reg_suffix;
  registration_service_priv *priv;
  proxy_conf *conf_local;
  registration_service_handle *rs_local;
  
  puVar1 = (undefined8 *)rs->priv;
  if (conf->public_addr == (char *)0x0) {
    local_60 = "";
  }
  else {
    local_60 = conf->public_addr;
  }
  if (conf->reg_name == (char *)0x0) {
    rs_local._4_4_ = 0;
  }
  else {
    mutex_lock((mutex_handle *)(puVar1 + 4));
    iVar3 = strcmp(conf->password,"PUBLIC");
    uVar2 = 0x4e;
    if (iVar3 == 0) {
      uVar2 = 0x59;
    }
    *(undefined1 *)(puVar1 + 3) = uVar2;
    *puVar1 = conf->reg_name;
    puVar1[1] = conf->reg_comment;
    if (puVar1[2] != 0) {
      free((void *)puVar1[2]);
    }
    sVar4 = strlen(local_60);
    local_30 = (uint8_t *)malloc(sVar4 + 0x39);
    if (local_30 == (uint8_t *)0x0) {
      local_54 = 0xfffffff4;
    }
    else {
      local_54 = sprintf((char *)local_30,"%s%s%s",*puVar1,local_60,"#5A!zu");
      if (-1 < (int)local_54) {
        digest_get(local_30,local_54,(uint8_t *)&public_addr);
        local_54 = sprintf((char *)local_30,"&a=%s&d=",local_60);
        if (-1 < (int)local_54) {
          digest_to_str((uint8_t *)&public_addr,(char *)(local_30 + (int)local_54));
          local_54 = sprintf((char *)(local_30 + (int)(local_54 + 0x20)),"&p=%d&v=%s",
                             (ulong)conf->port,"1.2.3o");
          if (-1 < (int)local_54) {
            puVar1[2] = local_30;
            local_30 = (uint8_t *)0x0;
            local_54 = worker_start((worker_handle *)(puVar1 + 5));
            if (((-1 < (int)local_54) &&
                (local_54 = worker_wake((worker_handle *)(puVar1 + 5)), -1 < (int)local_54)) &&
               (*(int *)(puVar1 + 0xb) == 3)) {
              *(undefined4 *)(puVar1 + 0xb) = 0;
            }
          }
        }
      }
    }
    mutex_unlock((mutex_handle *)(puVar1 + 4));
    free(local_30);
    rs_local._4_4_ = local_54;
  }
  return rs_local._4_4_;
}

Assistant:

int registration_service_start(struct registration_service_handle *rs,
			       const struct proxy_conf *conf)
{
	struct registration_service_priv *priv = rs->priv;
	char *reg_suffix = NULL;
	uint8_t digest[DIGEST_LEN];
	const char *public_addr = conf->public_addr == NULL ?
				   "" : conf->public_addr;
	int ret;

	if (conf->reg_name == NULL)
		return 0;

	mutex_lock(&priv->mutex);

	priv->public = strcmp(conf->password, "PUBLIC") == 0 ? 'Y' : 'N';

	priv->reg_name = conf->reg_name;
	priv->reg_comment = conf->reg_comment;

	if (priv->reg_suffix != NULL)
		free((void *)priv->reg_suffix);
	reg_suffix = malloc(strlen(public_addr) + (2 * DIGEST_LEN) +
			    sizeof(protocol_version) + 18);
	if (reg_suffix == NULL) {
		ret = -ENOMEM;
		goto registration_service_start_end;
	}

	ret = sprintf(reg_suffix, "%s%s%s", priv->reg_name, public_addr,
		      digest_salt);
	if (ret < 0)
		goto registration_service_start_end;

	digest_get((uint8_t *)reg_suffix, ret, digest);

	ret = sprintf(reg_suffix, "&a=%s&d=", public_addr);
	if (ret < 0)
		goto registration_service_start_end;

	digest_to_str(digest, &reg_suffix[ret]);

	ret = sprintf(&reg_suffix[ret + (2 * DIGEST_LEN)],
		      "&p=%d&v=%s", conf->port, protocol_version);
	if (ret < 0)
		goto registration_service_start_end;

	priv->reg_suffix = reg_suffix;
	reg_suffix = NULL;

	ret = worker_start(&priv->worker);
	if (ret < 0)
		goto registration_service_start_end;

	ret = worker_wake(&priv->worker);
	if (ret < 0)
		goto registration_service_start_end;

	if (priv->status == REGISTRATION_STATUS_OFF)
		priv->status = REGISTRATION_STATUS_UNKNOWN;

registration_service_start_end:
	mutex_unlock(&priv->mutex);

	free(reg_suffix);

	return ret;
}